

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O3

int __thiscall Fl_Dial::handle(Fl_Dial *this,int event,int X,int Y,int W,int H)

{
  double dVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  Fl_Widget *in_RAX;
  int iVar5;
  int iVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_38;
  
  iVar6 = 1;
  switch(event) {
  case 1:
    local_38.wp_ = in_RAX;
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_38,(Fl_Widget *)this);
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_38);
    if (local_38.wp_ == (Fl_Widget *)0x0) {
      return 1;
    }
  case 5:
    iVar6 = 1;
    iVar4 = (Fl::e_x - (W / 2 + X)) * H;
    iVar5 = (Fl::e_y - (H / 2 + Y)) * W;
    if (iVar4 == 0 && iVar5 == 0) {
      return 1;
    }
    fVar7 = atan2f((float)-iVar5,(float)iVar4);
    sVar2 = *(short *)&(this->super_Fl_Valuator).field_0xa6;
    sVar3 = *(short *)&(this->super_Fl_Valuator).field_0xa4;
    dVar10 = (double)((int)sVar2 - (int)sVar3);
    dVar8 = (this->super_Fl_Valuator).min;
    dVar1 = (this->super_Fl_Valuator).max;
    dVar11 = (double)(int)sVar3;
    dVar12 = (((this->super_Fl_Valuator).value_ - dVar8) * dVar10) / (dVar1 - dVar8) + dVar11;
    for (dVar9 = (double)(fVar7 * -180.0) / 3.141592653589793 + 270.0; dVar9 < dVar12 + -180.0;
        dVar9 = dVar9 + 360.0) {
    }
    for (; dVar12 + 180.0 < dVar9; dVar9 = dVar9 + -360.0) {
    }
    dVar12 = dVar8;
    if (sVar3 < sVar2) {
      if ((dVar11 < dVar9) && (dVar12 = dVar1, dVar9 < (double)(int)sVar2)) {
LAB_001ac047:
        dVar12 = dVar8 + ((dVar1 - dVar8) * (dVar9 - dVar11)) / dVar10;
      }
    }
    else if ((dVar9 < dVar11) && (dVar12 = dVar1, (double)(int)sVar2 < dVar9)) goto LAB_001ac047;
    dVar8 = Fl_Valuator::round(&this->super_Fl_Valuator,dVar12);
    dVar8 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar8);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar8);
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    break;
  default:
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int Fl_Dial::handle(int event, int X, int Y, int W, int H) {
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);  
    handle_push();
    if (wp.deleted()) return 1; }
  case FL_DRAG: {
    int mx = (Fl::event_x()-X-W/2)*H;
    int my = (Fl::event_y()-Y-H/2)*W;
    if (!mx && !my) return 1;
    double angle = 270-atan2((float)-my, (float)mx)*180/M_PI;
    double oldangle = (a2-a1)*(value()-minimum())/(maximum()-minimum()) + a1;
    while (angle < oldangle-180) angle += 360;
    while (angle > oldangle+180) angle -= 360;
    double val;
    if ((a1<a2) ? (angle <= a1) : (angle >= a1)) {
      val = minimum();
    } else if ((a1<a2) ? (angle >= a2) : (angle <= a2)) {
      val = maximum();
    } else {
      val = minimum() + (maximum()-minimum())*(angle-a1)/(a2-a1);
    }
    handle_drag(clamp(round(val)));
  } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_ENTER : /* FALLTHROUGH */
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}